

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastEr1S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  uchar uVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  uint16_t uVar8;
  unsigned_short uVar9;
  uint uVar10;
  char *pcVar11;
  uint *puVar12;
  ulong uVar13;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_140;
  byte local_131;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_130;
  uint8_t v;
  uint64_t local_128;
  TcParseTableBase *local_120;
  ParseContext *local_118;
  char *local_110;
  MessageLite *local_108;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_100;
  TcFieldData local_f8;
  TcFieldData local_f0;
  undefined1 local_e1;
  ulong uStack_e0;
  bool always_return;
  TcParseTableBase *local_d8;
  ParseContext *local_d0;
  char *local_c8;
  MessageLite *local_c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_a8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  local_128 = hasbits;
  local_120 = table;
  local_118 = ctx;
  local_110 = ptr;
  local_108 = msg;
  local_100 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_100);
  pMVar2 = local_108;
  pcVar11 = local_110;
  pPVar1 = local_118;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffed0);
    pcVar11 = MiniParse(pMVar2,pcVar11,pPVar1,(TcFieldData)aStack_130,local_120,local_128);
    return pcVar11;
  }
  bVar6 = local_110[1];
  bVar7 = true;
  local_131 = bVar6;
  if (bVar6 != 0) {
    bVar5 = TcFieldData::aux_idx((TcFieldData *)&local_100);
    bVar7 = bVar5 < bVar6;
  }
  pMVar2 = local_108;
  pcVar11 = local_110;
  pPVar1 = local_118;
  if (bVar7) {
    TcFieldData::TcFieldData((TcFieldData *)&local_140);
    pcVar11 = MiniParse(pMVar2,pcVar11,pPVar1,(TcFieldData)local_140,local_120,local_128);
    return pcVar11;
  }
  uVar10 = (uint)local_131;
  uVar8 = TcFieldData::offset((TcFieldData *)&local_100);
  puVar12 = (uint *)RefAt<int>(pMVar2,(ulong)uVar8);
  *puVar12 = uVar10;
  local_110 = local_110 + 2;
  bVar6 = TcFieldData::hasbit_idx((TcFieldData *)&local_100);
  pMVar2 = local_108;
  pcVar11 = local_110;
  pPVar1 = local_118;
  local_128 = 1L << (bVar6 & 0x3f) | local_128;
  TcFieldData::TcFieldData(&data_local);
  local_b8 = data_local.field_0;
  local_c0 = pMVar2;
  local_c8 = pcVar11;
  local_d0 = pPVar1;
  local_d8 = local_120;
  uStack_e0 = local_128;
  local_e1 = 0;
  bVar7 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar11);
  pMVar2 = local_c0;
  pcVar11 = local_c8;
  pPVar1 = local_d0;
  if (!bVar7) {
    TcFieldData::TcFieldData(&local_f0);
    if (local_d8->has_bits_offset != 0) {
      uVar10 = (uint)uStack_e0;
      puVar12 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_d8->has_bits_offset);
      *puVar12 = uVar10 | *puVar12;
    }
    return pcVar11;
  }
  TcFieldData::TcFieldData(&local_f8);
  this = local_d8;
  uVar3 = uStack_e0;
  uVar9 = UnalignedLoad<unsigned_short>(pcVar11);
  uVar13 = (ulong)(int)((uint)uVar9 & (uint)this->fast_idx_mask);
  if ((uVar13 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar13 >> 3);
  local_a8.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar9;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_b0.data = local_a8.data;
  pcVar11 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar11,pPVar1,(TcFieldData)local_a8,this,uVar3);
  return pcVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr1S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularEnumSmallRange<uint8_t, 1>(
      PROTOBUF_TC_PARAM_PASS);
}